

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O1

void __thiscall SQOuter::~SQOuter(SQOuter *this)

{
  ~SQOuter(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~SQOuter() { REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this); }